

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O1

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (RangeSelectExpression *this,SampledValueExprVisitor *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->value_,this->value_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }